

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::InitTileOffsets
              (OffsetData *offset_data,EXRHeader *exr_header,
              vector<int,_std::allocator<int>_> *num_x_tiles,
              vector<int,_std::allocator<int>_> *num_y_tiles)

{
  int iVar1;
  pointer pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  pointer pvVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  long local_48;
  
  iVar1 = (int)((ulong)((long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  offset_data->num_x_levels = iVar1;
  iVar3 = (int)((ulong)((long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  offset_data->num_y_levels = iVar3;
  iVar6 = 0;
  iVar7 = iVar6;
  if ((uint)exr_header->tile_level_mode < 2) {
    iVar7 = 0;
    if (iVar1 == iVar3) {
      std::
      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::resize(&offset_data->offsets,(long)iVar1);
      pvVar8 = (offset_data->offsets).
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar7 = iVar6;
      if ((offset_data->offsets).
          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar8) {
        uVar11 = 0;
        iVar7 = 0;
        do {
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::resize(pvVar8 + uVar11,
                   (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar11]);
          pvVar8 = (offset_data->offsets).
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar2 = *(pointer *)
                    &pvVar8[uVar11].
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl;
          if (*(pointer *)
               ((long)&pvVar8[uVar11].
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl + 8) != pvVar2) {
            uVar4 = 0;
            uVar5 = 1;
            do {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                        (pvVar2 + uVar4,
                         (long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[uVar11]);
              iVar7 = iVar7 + (num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[uVar11];
              pvVar8 = (offset_data->offsets).
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar2 = *(pointer *)
                        &pvVar8[uVar11].
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl;
              uVar4 = ((long)*(pointer *)
                              ((long)&pvVar8[uVar11].
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl + 8) - (long)pvVar2 >> 3) * -0x5555555555555555;
              bVar12 = uVar5 <= uVar4;
              lVar10 = uVar4 - uVar5;
              uVar4 = uVar5;
              uVar5 = (ulong)((int)uVar5 + 1);
            } while (bVar12 && lVar10 != 0);
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          pvVar8 = (offset_data->offsets).
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = ((long)(offset_data->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                  -0x5555555555555555;
        } while (uVar11 <= uVar4 && uVar4 - uVar11 != 0);
      }
    }
  }
  else if ((exr_header->tile_level_mode == 2) &&
          (std::
           vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ::resize(&offset_data->offsets,(long)iVar3 * (long)iVar1), 0 < offset_data->num_y_levels)
          ) {
    local_48 = 0;
    iVar7 = 0;
    do {
      uVar11 = (ulong)(uint)offset_data->num_x_levels;
      if (0 < offset_data->num_x_levels) {
        lVar10 = 0;
        do {
          iVar1 = (int)uVar11 * (int)local_48 + (int)lVar10;
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::resize((offset_data->offsets).
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar1,
                   (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[local_48]);
          pvVar8 = (offset_data->offsets).
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar2 = *(pointer *)
                    &pvVar8[iVar1].
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl;
          if (*(pointer *)
               ((long)&pvVar8[iVar1].
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl + 8) != pvVar2) {
            lVar9 = 0;
            uVar11 = 0;
            do {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         ((long)&(pvVar2->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl + lVar9),
                         (long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[lVar10]);
              iVar7 = iVar7 + (num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar10];
              uVar11 = uVar11 + 1;
              pvVar8 = (offset_data->offsets).
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar2 = *(pointer *)
                        &pvVar8[iVar1].
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl;
              lVar9 = lVar9 + 0x18;
            } while (uVar11 < (ulong)(((long)*(pointer *)
                                              ((long)&pvVar8[iVar1].
                                                                                                            
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl + 8) - (long)pvVar2 >> 3) *
                                     -0x5555555555555555));
          }
          lVar10 = lVar10 + 1;
          uVar11 = (ulong)offset_data->num_x_levels;
        } while (lVar10 < (long)uVar11);
      }
      local_48 = local_48 + 1;
    } while (local_48 < offset_data->num_y_levels);
  }
  return iVar7;
}

Assistant:

static int InitTileOffsets(OffsetData& offset_data,
  const EXRHeader* exr_header,
  const std::vector<int>& num_x_tiles,
  const std::vector<int>& num_y_tiles) {
  int num_tile_blocks = 0;
  offset_data.num_x_levels = static_cast<int>(num_x_tiles.size());
  offset_data.num_y_levels = static_cast<int>(num_y_tiles.size());
  switch (exr_header->tile_level_mode) {
  case TINYEXR_TILE_ONE_LEVEL:
  case TINYEXR_TILE_MIPMAP_LEVELS:
    TINYEXR_CHECK_AND_RETURN_C(offset_data.num_x_levels == offset_data.num_y_levels, 0);
    offset_data.offsets.resize(size_t(offset_data.num_x_levels));

    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
      offset_data.offsets[l].resize(size_t(num_y_tiles[l]));

      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
        offset_data.offsets[l][dy].resize(size_t(num_x_tiles[l]));
        num_tile_blocks += num_x_tiles[l];
      }
    }
    break;

  case TINYEXR_TILE_RIPMAP_LEVELS:

    offset_data.offsets.resize(static_cast<size_t>(offset_data.num_x_levels) * static_cast<size_t>(offset_data.num_y_levels));

    for (int ly = 0; ly < offset_data.num_y_levels; ++ly) {
      for (int lx = 0; lx < offset_data.num_x_levels; ++lx) {
        int l = ly * offset_data.num_x_levels + lx;
        offset_data.offsets[size_t(l)].resize(size_t(num_y_tiles[size_t(ly)]));

        for (size_t dy = 0; dy < offset_data.offsets[size_t(l)].size(); ++dy) {
          offset_data.offsets[size_t(l)][dy].resize(size_t(num_x_tiles[size_t(lx)]));
          num_tile_blocks += num_x_tiles[size_t(lx)];
        }
      }
    }
    break;

  default:
    return 0;
  }
  return num_tile_blocks;
}